

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

void __thiscall
Js::RecyclableObjectWalker::InsertItem
          (RecyclableObjectWalker *this,PropertyId propertyId,bool isConst,bool isUnscoped,
          Var itemObj,RecyclableMethodsGroupWalker **ppMethodsGroupWalker,bool shouldPinProperty)

{
  Type TVar1;
  int iVar2;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertyRecord *pPVar7;
  ArenaAllocator *alloc;
  RecyclableObject *this_02;
  RecyclableMethodsGroupWalker *pRVar8;
  DebuggerPropertyDisplayInfo *pDVar9;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  
  if (propertyId == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9b,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_008b56de;
    *puVar6 = 0;
  }
  if (ppMethodsGroupWalker == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9c,"(ppMethodsGroupWalker)","ppMethodsGroupWalker");
    if (!bVar4) goto LAB_008b56de;
    *puVar6 = 0;
  }
  if (itemObj == (Var)0x0) {
    itemObj = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  if (shouldPinProperty) {
    pPVar7 = ScriptContext::GetPropertyName(this->scriptContext,propertyId);
    if (pPVar7 != (PropertyRecord *)0x0) {
      ScriptContext::GetDebugContext(this->scriptContext);
    }
  }
  alloc = GetArenaFromContext(this->scriptContext);
  if ((RecyclableObject *)itemObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_008b56de;
    *puVar6 = 0;
LAB_008b54cd:
    this_02 = UnsafeVarTo<Js::RecyclableObject>(itemObj);
    if (this_02 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_008b56de;
      *puVar6 = 0;
    }
    TVar1 = ((this_02->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Function) {
        if ((this->scriptContext->threadContext->debugManager->localsDisplayFlags & 1) == 0) {
          EnsureFakeGroupObjectWalkerList(this);
          pRVar8 = *ppMethodsGroupWalker;
          if (pRVar8 == (RecyclableMethodsGroupWalker *)0x0) {
            pRVar8 = (RecyclableMethodsGroupWalker *)
                     new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
            RecyclableMethodsGroupWalker::RecyclableMethodsGroupWalker
                      (pRVar8,this->scriptContext,this->instance);
            *ppMethodsGroupWalker = pRVar8;
            this_00 = this->fakeGroupObjectWalkerList;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,0);
            iVar2 = (this_00->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_00->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar2] = (IDiagObjectModelWalkerBase *)pRVar8;
            (this_00->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar2 + 1;
            pRVar8 = *ppMethodsGroupWalker;
          }
          RecyclableMethodsGroupWalker::AddItem(pRVar8,propertyId,itemObj);
          return;
        }
        pDVar9 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
        pDVar9->propId = propertyId;
        pDVar9->aVar = itemObj;
        pDVar9->flags = 1;
        goto LAB_008b5685;
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this_02);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_008b563f;
      }
    }
  }
  else if (((ulong)itemObj & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)itemObj & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)itemObj >> 0x32 == 0 && ((ulong)itemObj & 0xffff000000000000) != 0x1000000000000)
    goto LAB_008b54cd;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_008b563f:
    bVar4 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar4) {
LAB_008b56de:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pDVar9 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470);
  pDVar9->propId = propertyId;
  pDVar9->aVar = itemObj;
  pDVar9->flags = (uint)isConst + (uint)isUnscoped * 4;
LAB_008b5685:
  this_01 = this->pMembersList;
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(this_01,0);
  iVar2 = (this_01->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  (this_01->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar2] = pDVar9;
  (this_01->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar2 + 1;
  return;
}

Assistant:

void RecyclableObjectWalker::InsertItem(
        PropertyId propertyId,
        bool isConst,
        bool isUnscoped,
        Var itemObj,
        Js:: RecyclableMethodsGroupWalker **ppMethodsGroupWalker,
        bool shouldPinProperty /* = false*/)
    {
        Assert(propertyId);
        Assert(ppMethodsGroupWalker);

        if (itemObj == nullptr)
        {
            itemObj = scriptContext->GetLibrary()->GetUndefined();
        }

        if (shouldPinProperty)
        {
            const Js::PropertyRecord * propertyRecord = scriptContext->GetPropertyName(propertyId);
            if (propertyRecord)
            {
                // Pin this record so that it will not go away till we are done with this break.
                scriptContext->GetDebugContext()->GetProbeContainer()->PinPropertyRecord(propertyRecord);
            }
        }

        ArenaAllocator *arena = GetArenaFromContext(scriptContext);

        if (JavascriptOperators::GetTypeId(itemObj) == TypeIds_Function)
        {
            if (scriptContext->GetThreadContext()->GetDebugManager()->IsLocalsDisplayFlagsSet(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods))
            {
                DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, DebuggerPropertyDisplayInfoFlags_Const);
                pMembersList->Add(info);
            }
            else
            {
                EnsureFakeGroupObjectWalkerList();

                if (*ppMethodsGroupWalker == nullptr)
                {
                    *ppMethodsGroupWalker = Anew(arena, RecyclableMethodsGroupWalker, scriptContext, instance);
                    fakeGroupObjectWalkerList->Add(*ppMethodsGroupWalker);
                }

                (*ppMethodsGroupWalker)->AddItem(propertyId, itemObj);
            }
        }
        else
        {
            DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
            flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
            flags |= isUnscoped ? DebuggerPropertyDisplayInfoFlags_Unscope : 0;

            DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, flags);

            pMembersList->Add(info);
        }
    }